

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O3

void __thiscall
BamTools::SplitTool::SplitToolPrivate::DetermineOutputFilenameStub(SplitToolPrivate *this)

{
  SplitSettings *pSVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pSVar1 = this->m_settings;
  if (pSVar1->HasCustomOutputStub == true) {
    std::__cxx11::string::_M_assign((string *)&this->m_outputFilenameStub);
    return;
  }
  if (pSVar1->HasInputFilename == true) {
    std::__cxx11::string::rfind((char)&pSVar1->InputFilename,0x2e);
    std::__cxx11::string::substr((ulong)local_38,(ulong)&pSVar1->InputFilename);
    std::__cxx11::string::operator=((string *)&this->m_outputFilenameStub,(string *)local_38);
  }
  else {
    GetTimestampString_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->m_outputFilenameStub,(string *)local_38);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void SplitTool::SplitToolPrivate::DetermineOutputFilenameStub()
{

    // if user supplied output filename stub, use that
    if (m_settings->HasCustomOutputStub) m_outputFilenameStub = m_settings->CustomOutputStub;

    // else if user supplied input BAM filename, use that (minus ".bam" extension) as stub
    else if (m_settings->HasInputFilename)
        m_outputFilenameStub = RemoveFilenameExtension(m_settings->InputFilename);

    // otherwise, user did not specify -stub, and input is coming from STDIN
    // generate stub from timestamp
    else
        m_outputFilenameStub = GetTimestampString();
}